

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O1

int __thiscall Lexico::PosicaoIndice(Lexico *this,char ch)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = -0x21;
  do {
    if (this->indice[lVar3 + 0x23] == ch) {
      return (int)lVar3 + 0x23;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  iVar1 = isalpha((int)ch);
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar2 = ((int)ch - 0x30U < 10) - 1 | 1;
  }
  return uVar2;
}

Assistant:

int Lexico::PosicaoIndice (char ch) {
  int i = 2;
  while (i < alfabeto) {
    if (ch == indice[i])
      return i;
    i++;
  }
  if (isalpha(ch))
    return 0;
  if (isdigit(ch))
    return 1;
  return -1;
}